

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

void sysbvm_dictionary_atPut
               (sysbvm_context_t *context,sysbvm_tuple_t dictionary,sysbvm_tuple_t key,
               sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  long lVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  int64_t svalue;
  ulong uVar6;
  anon_struct_32_4_8173420c gcFrame;
  sysbvm_dictionary_t *local_58;
  sysbvm_tuple_t local_50;
  sysbvm_tuple_t local_48;
  long local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_20 = (undefined1 *)&local_58;
  if ((dictionary & 0xf) == 0 && dictionary != 0) {
    local_40 = 0;
    local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_38._12_4_ = 0;
    local_28 = 4;
    local_58 = (sysbvm_dictionary_t *)dictionary;
    local_50 = key;
    local_48 = value;
    sysbvm_stackFrame_pushRecord(&local_38);
    lVar3 = sysbvm_dictionary_scanFor(context,&local_58,&local_50);
    if (lVar3 < 0) {
      sysbvm_dictionary_increaseCapacity(context,&local_58);
      lVar3 = sysbvm_dictionary_scanFor(context,&local_58,&local_50);
      if (lVar3 < 0) {
        sysbvm_error("Dictionary out of memory.");
      }
    }
    sVar1 = local_58->storage;
    local_40 = *(long *)(sVar1 + 0x10 + lVar3 * 8);
    if (local_40 == 0) {
      sVar4 = sysbvm_association_create(context,local_50,local_48);
      *(sysbvm_tuple_t *)(sVar1 + 0x10 + lVar3 * 8) = sVar4;
      uVar6 = local_58->storage;
      if ((uVar6 & 0xf) == 0 && uVar6 != 0) {
        uVar6 = (ulong)(*(uint *)(uVar6 + 0xc) >> 1 & 0xfffffffc) / 5;
      }
      else {
        uVar6 = 0;
      }
      uVar2 = local_58->size;
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        lVar3 = (long)uVar2 >> 4;
      }
      else {
        lVar3 = *(long *)(uVar2 + 0x10);
      }
      uVar2 = lVar3 + 1;
      if (lVar3 + 0x800000000000001U >> 0x3c == 0) {
        uVar5 = uVar2 * 0x10 | 0xb;
      }
      else {
        uVar5 = sysbvm_tuple_uint64_encodeBig(context,uVar2);
      }
      local_58->size = uVar5;
      if (uVar6 <= uVar2) {
        sysbvm_dictionary_increaseCapacity(context,&local_58);
      }
    }
    else {
      *(sysbvm_tuple_t *)(local_40 + 0x18) = local_48;
    }
    sysbvm_stackFrame_popRecord(&local_38);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dictionary_atPut(sysbvm_context_t *context, sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(dictionary)) return;

    struct {
        sysbvm_dictionary_t *dictionary;
        sysbvm_tuple_t key;
        sysbvm_tuple_t value;
        sysbvm_association_t *association;
    } gcFrame = {
        .dictionary = (sysbvm_dictionary_t*)dictionary,
        .key = key,
        .value = value,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    intptr_t elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
    if(elementIndex < 0)
    {
        sysbvm_dictionary_increaseCapacity(context, &gcFrame.dictionary);
        elementIndex = sysbvm_dictionary_scanFor(context, &gcFrame.dictionary, &gcFrame.key);
        if(elementIndex < 0)
           sysbvm_error("Dictionary out of memory.");
    }

    sysbvm_array_t *storage = (sysbvm_array_t*)gcFrame.dictionary->storage;
    gcFrame.association = (sysbvm_association_t*)storage->elements[elementIndex];
    if(gcFrame.association)
    {
        gcFrame.association->value = gcFrame.value;
    }
    else
    {
        storage->elements[elementIndex] = sysbvm_association_create(context, gcFrame.key, gcFrame.value);
        size_t capacity = sysbvm_tuple_getSizeInSlots(gcFrame.dictionary->storage);
        size_t newSize = sysbvm_tuple_size_decode(gcFrame.dictionary->size) + 1;
        gcFrame.dictionary->size = sysbvm_tuple_size_encode(context, newSize);
        size_t capacityThreshold = capacity * 4 / 5;

        // Make sure the maximum occupancy rate is not greater than 80%.
        if(newSize >= capacityThreshold)
            sysbvm_dictionary_increaseCapacity(context, &gcFrame.dictionary);
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
}